

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O1

longdouble * get_big_float(longdouble *__return_storage_ptr__,FMFieldPtr field,void *data)

{
  undefined8 *puVar1;
  undefined1 uVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  longdouble *plVar7;
  longdouble *extraout_RAX;
  undefined4 extraout_var;
  ulong uVar8;
  long lVar9;
  void *data_00;
  ulong uVar10;
  longdouble in_ST0;
  float tmp;
  undefined8 local_28;
  undefined8 uStack_20;
  
  iVar6 = *(int *)((long)__return_storage_ptr__ + 0xc);
  if (iVar6 == 1) {
    plVar7 = (longdouble *)get_big_int((FMFieldPtr)__return_storage_ptr__,field);
    return plVar7;
  }
  if (iVar6 == 2) {
    plVar7 = (longdouble *)get_big_unsigned((FMFieldPtr)__return_storage_ptr__,field);
    return plVar7;
  }
  if (iVar6 != 3) {
    get_big_float_cold_2();
    get_big_float(__return_storage_ptr__,field,data_00);
    return (longdouble *)(double)in_ST0;
  }
  uVar5 = *(uint *)((long)__return_storage_ptr__ + 8);
  if (uVar5 == 0x10) {
    puVar1 = (undefined8 *)((long)&field->offset + (long)*(longdouble **)__return_storage_ptr__);
    local_28 = *puVar1;
    uStack_20 = puVar1[1];
    if (*(char *)(__return_storage_ptr__ + 1) == '\0') {
      return *(longdouble **)__return_storage_ptr__;
    }
    plVar7 = (longdouble *)0xf00000000;
    lVar9 = 0;
    do {
      uVar2 = *(undefined1 *)((long)&local_28 + lVar9);
      *(undefined1 *)((long)&local_28 + lVar9) =
           *(undefined1 *)((long)&local_28 + ((ulong)plVar7 >> 0x20));
      *(undefined1 *)((long)&local_28 + ((ulong)plVar7 >> 0x20)) = uVar2;
      lVar9 = lVar9 + 1;
      plVar7 = plVar7 + -0x10000000;
    } while (lVar9 != 8);
    return plVar7;
  }
  if (uVar5 != 8) {
    if (uVar5 != 4) {
      if (get_big_float::get_double_warn != 0) {
        return (longdouble *)(ulong)uVar5;
      }
      get_big_float_cold_1();
      return extraout_RAX;
    }
    uVar5 = *(uint *)((long)&field->offset + *(long *)__return_storage_ptr__);
    local_28 = CONCAT44(local_28._4_4_,uVar5);
    if (*(char *)(__return_storage_ptr__ + 1) == '\0') {
      return (longdouble *)(ulong)uVar5;
    }
    uVar8 = 0x300000000;
    lVar9 = 0;
    do {
      uVar2 = *(undefined1 *)((long)&local_28 + lVar9);
      *(undefined1 *)((long)&local_28 + lVar9) = *(undefined1 *)((long)&local_28 + (uVar8 >> 0x20));
      *(undefined1 *)((long)&local_28 + (uVar8 >> 0x20)) = uVar2;
      lVar9 = lVar9 + 1;
      uVar8 = uVar8 - 0x100000000;
    } while (lVar9 != 2);
    return (longdouble *)0xffffffff00000000;
  }
  local_28 = *(undefined8 *)((long)&field->offset + *(long *)__return_storage_ptr__);
  bVar3 = *(byte *)((long)__return_storage_ptr__ + 0x11);
  bVar4 = *(byte *)((long)__return_storage_ptr__ + 0x12);
  if (bVar3 == bVar4) {
    return (longdouble *)(ulong)bVar3;
  }
  if (fm_reverse_float_formats[(uint)bVar4] == (uint)bVar3) {
    plVar7 = (longdouble *)0x700000000;
    lVar9 = 0;
    do {
      uVar2 = *(undefined1 *)((long)&local_28 + lVar9);
      *(undefined1 *)((long)&local_28 + lVar9) =
           *(undefined1 *)((long)&local_28 + ((ulong)plVar7 >> 0x20));
      *(undefined1 *)((long)&local_28 + ((ulong)plVar7 >> 0x20)) = uVar2;
      lVar9 = lVar9 + 1;
      plVar7 = plVar7 + -0x10000000;
    } while (lVar9 != 4);
    return plVar7;
  }
  uVar5 = (uint)bVar3 << 0x10 | (uint)bVar4;
  if (uVar5 < 0x30001) {
    if (uVar5 == 0x10003) {
LAB_001220c1:
      uVar8 = 0x300000000;
      lVar9 = 0;
      uVar10 = 0x300000000;
      do {
        uVar2 = *(undefined1 *)((long)&local_28 + lVar9);
        *(undefined1 *)((long)&local_28 + lVar9) =
             *(undefined1 *)((long)&local_28 + (uVar10 >> 0x20));
        *(undefined1 *)((long)&local_28 + (uVar10 >> 0x20)) = uVar2;
        lVar9 = lVar9 + 1;
        uVar10 = uVar10 - 0x100000000;
      } while (lVar9 != 2);
      lVar9 = 0;
      do {
        uVar2 = *(undefined1 *)((long)&local_28 + lVar9 + 4);
        *(undefined1 *)((long)&local_28 + lVar9 + 4) =
             *(undefined1 *)((long)&local_28 + (uVar8 >> 0x20) + 4);
        *(undefined1 *)((long)&local_28 + (uVar8 >> 0x20) + 4) = uVar2;
        lVar9 = lVar9 + 1;
        uVar8 = uVar8 - 0x100000000;
      } while (lVar9 != 2);
      return (longdouble *)0xffffffff00000000;
    }
    if (uVar5 == 0x20003) {
      return (longdouble *)(ulong)uVar5;
    }
  }
  else {
    if (uVar5 == 0x30002) {
      return (longdouble *)(ulong)uVar5;
    }
    if (uVar5 == 0x30001) goto LAB_001220c1;
  }
  iVar6 = puts("unanticipated float conversion ");
  return (longdouble *)CONCAT44(extraout_var,iVar6);
}

Assistant:

static MAX_FLOAT_TYPE
get_big_float(FMFieldPtr field, void *data)
{
    if (field->data_type == float_type) {
	if (field->size == sizeof(float)) {
	    float tmp;
	    MAX_FLOAT_TYPE tmp2;
	    memcpy(&tmp, ((char *) data + field->offset), sizeof(float));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int)sizeof(float));
	    tmp2 = tmp;
	    return tmp2;
	} else if (field->size == sizeof(double)) {
	    double tmp;
	    MAX_FLOAT_TYPE tmp2;
	    memcpy(&tmp, ((char *) data + field->offset), sizeof(double));
	    float_conversion((unsigned char *)&tmp, sizeof(double), 
			     (FMfloat_format)field->src_float_format,
			     (FMfloat_format)field->target_float_format);
	    tmp2 = tmp;
	    return tmp2;
#if SIZEOF_LONG_DOUBLE != 0
	} else if (field->size == sizeof(long double)) {
	    long double tmp;
	    MAX_FLOAT_TYPE tmp2;
	    memcpy(&tmp, ((char *) data + field->offset),
		   sizeof(long double));
	    if (field->byte_swap)
		byte_swap((char *) &tmp,
			  (int)sizeof(long double));
	    tmp2 = tmp;
	    return tmp2;
#endif
	} else {
	    static int get_double_warn = 0;
	    if (!get_double_warn) {
		fprintf(stderr, "Get Double failed!  Size problems.  File double size is %d.\n", field->size);
		get_double_warn++;
	    }
	    return 0.0;
	}
    } else if (field->data_type == integer_type) {
	MAX_INTEGER_TYPE tmp = get_big_int(field, data);
#ifndef METICULOUS_FLOATS_AND_LONGS
	/* 
	 * A concession to inter-compiler interoperability...  We
	 * shouldn't need the (double)(long) casts here.  If we don't
	 * use them, AND we're on a machine which doesn't support "long 
	 * long" and "long double" in native code, gcc generates calls 
	 * to libgcc and the resulting library can't be linked with
	 * anything but GCC.  This can be a problem for installed
	 * libraries.  Using the casts avoids that particular problem,
	 * at a cost of data loss in the case of someone converting a
	 * "long long" that doesn't fit in a long to a floating point
	 * value. 
	 */
	return (MAX_FLOAT_TYPE) (double) (long) tmp;
#else
	return (MAX_FLOAT_TYPE) tmp;
#endif
    } else if (field->data_type == unsigned_type) {
	MAX_UNSIGNED_TYPE tmp = get_big_unsigned(field, data);
#ifndef METICULOUS_FLOATS_AND_LONGS
	return (MAX_FLOAT_TYPE) (double) (long) tmp;
#else
	return (MAX_FLOAT_TYPE) tmp;
#endif
    } else {
	fprintf(stderr, "Get Double failed on invalid data type!\n");
	exit(1);
    }
    /* NOTREACHED */
    return 0;
}